

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O3

void Nwk_ObjDeleteFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  int iVar1;
  Nwk_Obj_t *pNVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  iVar1 = pObj->nFanins;
  uVar4 = pObj->nFanouts + iVar1;
  if (uVar4 != 0 && SCARRY4(pObj->nFanouts,iVar1) == (int)uVar4 < 0) {
    uVar7 = 0;
    bVar3 = false;
    iVar6 = 0;
    do {
      pNVar2 = pObj->pFanio[uVar7];
      if ((bVar3) || (pNVar2 != pFanin)) {
        lVar5 = (long)iVar6;
        iVar6 = iVar6 + 1;
        pObj->pFanio[lVar5] = pNVar2;
      }
      else {
        bVar3 = true;
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    if (uVar4 == iVar6 + 1U) {
      pObj->nFanins = iVar1 + -1;
      uVar4 = pFanin->nFanins;
      iVar1 = pFanin->nFanouts;
      if (iVar1 < 1) {
        uVar7 = (ulong)uVar4;
      }
      else {
        uVar7 = (ulong)(int)uVar4;
        iVar6 = iVar1 + uVar4;
        bVar3 = false;
        do {
          pNVar2 = pFanin->pFanio[uVar7];
          if ((bVar3) || (pNVar2 != pObj)) {
            lVar5 = (long)(int)uVar4;
            uVar4 = uVar4 + 1;
            pFanin->pFanio[lVar5] = pNVar2;
          }
          else {
            bVar3 = true;
          }
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)iVar6);
      }
      if ((int)uVar7 != uVar4 + 1) {
        __assert_fail("i == k + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                      ,0xd5,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
      }
      pFanin->nFanouts = iVar1 + -1;
      return;
    }
  }
  __assert_fail("i == k + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                ,0xcb,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjDeleteFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i, k, Limit, fFound;
    // remove pFanin from the fanin list of pObj
    Limit = pObj->nFanins + pObj->nFanouts;
    fFound = 0;
    for ( k = i = 0; i < Limit; i++ )
        if ( fFound || pObj->pFanio[i] != pFanin )
            pObj->pFanio[k++] = pObj->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanin
    pObj->nFanins--;
    // remove pObj from the fanout list of pFanin
    Limit = pFanin->nFanins + pFanin->nFanouts;
    fFound = 0;
    for ( k = i = pFanin->nFanins; i < Limit; i++ )
        if ( fFound || pFanin->pFanio[i] != pObj )
            pFanin->pFanio[k++] = pFanin->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanout
    pFanin->nFanouts--; 
}